

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

bool __thiscall despot::util::tinyxml::TiXmlPrinter::Visit(TiXmlPrinter *this,TiXmlUnknown *unknown)

{
  TiXmlString *this_00;
  
  DoIndent(this);
  this_00 = &this->buffer;
  TiXmlString::operator+=(this_00,"<");
  TiXmlString::operator+=(this_00,((unknown->super_TiXmlNode).value.rep_)->str);
  TiXmlString::operator+=(this_00,">");
  DoLineBreak(this);
  return true;
}

Assistant:

bool TiXmlPrinter::Visit(const TiXmlUnknown& unknown) {
	DoIndent();
	buffer += "<";
	buffer += unknown.Value();
	buffer += ">";
	DoLineBreak();
	return true;
}